

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O0

TokenOrSyntax * __thiscall
slang::syntax::RandCaseItemSyntax::getChild(RandCaseItemSyntax *this,size_t index)

{
  Token token;
  long in_RDX;
  Info *in_RSI;
  TokenOrSyntax *in_RDI;
  SyntaxNode *in_stack_ffffffffffffffb8;
  TokenOrSyntax *pTVar1;
  
  pTVar1 = in_RDI;
  if (in_RDX == 0) {
    not_null<slang::syntax::ExpressionSyntax_*>::get
              ((not_null<slang::syntax::ExpressionSyntax_*> *)&in_RSI[1].location);
    TokenOrSyntax::TokenOrSyntax(in_RDI,in_stack_ffffffffffffffb8);
  }
  else if (in_RDX == 1) {
    token.info = in_RSI;
    token._0_8_ = in_RDI;
    TokenOrSyntax::TokenOrSyntax(in_RDI,token);
    pTVar1 = in_RDI;
  }
  else if (in_RDX == 2) {
    not_null<slang::syntax::StatementSyntax_*>::get
              ((not_null<slang::syntax::StatementSyntax_*> *)(in_RSI + 3));
    TokenOrSyntax::TokenOrSyntax(in_RDI,in_stack_ffffffffffffffb8);
  }
  else {
    TokenOrSyntax::TokenOrSyntax((TokenOrSyntax *)in_RSI,in_RDI);
    pTVar1 = in_RDI;
  }
  return pTVar1;
}

Assistant:

TokenOrSyntax RandCaseItemSyntax::getChild(size_t index) {
    switch (index) {
        case 0: return expr.get();
        case 1: return colon;
        case 2: return statement.get();
        default: return nullptr;
    }
}